

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

char * spvGeneratorStr(uint32_t generator)

{
  undefined *puVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0xc;
  lVar2 = 0;
  do {
    if (*(uint32_t *)((long)&(anonymous_namespace)::vendor_tools + lVar2) == generator)
    goto LAB_00205d97;
    if (*(uint32_t *)((long)&DAT_004c5950 + lVar2) == generator) {
      if (lVar2 == 0x580) {
        return "Unknown";
      }
      puVar1 = (undefined *)((long)&DAT_004c5950 + lVar2);
      goto LAB_00205d9a;
    }
    if (*(uint32_t *)((long)&DAT_004c5970 + lVar2) == generator) {
      lVar2 = lVar2 + 0x40;
LAB_00205d97:
      puVar1 = (undefined *)((long)&(anonymous_namespace)::vendor_tools + lVar2);
      goto LAB_00205d9a;
    }
    if (*(uint32_t *)((long)&DAT_004c5990 + lVar2) == generator) {
      lVar2 = lVar2 + 0x60;
      goto LAB_00205d97;
    }
    lVar2 = lVar2 + 0x80;
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  if (generator != 0x2c) {
    return "Unknown";
  }
  puVar1 = &DAT_004c5eb0;
LAB_00205d9a:
  return *(char **)(puVar1 + 0x18);
}

Assistant:

const char* spvGeneratorStr(uint32_t generator) {
  auto where = std::find_if(
      std::begin(vendor_tools), std::end(vendor_tools),
      [generator](const VendorTool& vt) { return generator == vt.value; });
  if (where != std::end(vendor_tools)) return where->vendor_tool;
  return "Unknown";
}